

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

ExecState __thiscall
Process::startInternal
          (Process *this,Path *command,List<String> *a,List<String> *environment,int timeout,
          uint execFlags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  bool bVar4;
  bool bVar5;
  __pid_t _Var6;
  int iVar7;
  int *piVar8;
  size_t sVar9;
  ulong uVar10;
  char **__argv;
  char *pcVar11;
  String *pSVar12;
  pointer pSVar13;
  ssize_t sVar14;
  element_type *peVar15;
  int __sig;
  timeval *local_678;
  String local_440;
  int local_41c;
  Process *pPStack_418;
  int lasted;
  int local_40c;
  int w;
  lock_guard<std::mutex> lock;
  String local_3e0;
  int local_3c0;
  int local_3bc;
  int ret_1;
  int max;
  fd_set *__arr_1;
  __fd_mask *p_Stack_3a8;
  uint __i_1;
  fd_set *__arr;
  undefined1 local_398 [4];
  uint __i;
  fd_set wfds;
  fd_set rfds;
  timeval timeoutForSelect;
  timeval now;
  timeval started;
  code *local_260;
  undefined8 local_258;
  type local_250;
  function<void_(int,_unsigned_int)> local_238;
  Process *local_218;
  code *local_210;
  undefined8 local_208;
  type local_200;
  function<void_(int,_unsigned_int)> local_1e8;
  undefined1 local_1c8 [8];
  SharedPtr loop;
  String local_198;
  undefined1 local_175;
  uint local_174;
  char c_1;
  int flags;
  undefined1 local_168 [3];
  char c;
  int ret;
  __normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_> local_148;
  __normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_> local_140;
  const_iterator it_2;
  char **env;
  iterator iStack_128;
  bool hasEnviron;
  __normal_iterator<String_*,_std::vector<String,_std::allocator<String>_>_> local_120;
  __normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_> local_118;
  const_iterator it_1;
  int pos;
  char **args;
  int local_dc;
  int local_d8;
  int closePipe [2];
  int err;
  List<String> arguments;
  String local_b0;
  undefined1 local_80 [8];
  Path cmd;
  String *it;
  const_iterator __end1;
  const_iterator __begin1;
  List<String> *__range1;
  char *path;
  uint execFlags_local;
  int timeout_local;
  List<String> *environment_local;
  List<String> *a_local;
  Path *command_local;
  Process *this_local;
  
  String::clear(&this->mErrorString);
  __range1 = (List<String> *)0x0;
  __end1 = std::vector<String,_std::allocator<String>_>::begin
                     (&environment->super_vector<String,_std::allocator<String>_>);
  it = (String *)
       std::vector<String,_std::allocator<String>_>::end
                 (&environment->super_vector<String,_std::allocator<String>_>);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>
                                     *)&it), bVar4) {
    cmd.super_String.mString.field_2._8_8_ =
         __gnu_cxx::__normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>
         ::operator*(&__end1);
    bVar4 = String::startsWith((String *)cmd.super_String.mString.field_2._8_8_,"PATH=",
                               0xffffffffffffffff,CaseSensitive);
    if (bVar4) {
      pcVar11 = String::constData((String *)cmd.super_String.mString.field_2._8_8_);
      __range1 = (List<String> *)(pcVar11 + 5);
      break;
    }
    __gnu_cxx::__normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>::
    operator++(&__end1);
  }
  findCommand((Path *)local_80,&command->super_String,(char *)__range1);
  bVar4 = String::isEmpty((String *)local_80);
  if (bVar4) {
    String::String(&local_b0,"Command not found",0xffffffffffffffff);
    String::operator=(&this->mErrorString,&local_b0);
    String::~String(&local_b0);
    this_local._4_4_ = Error;
    goto LAB_002aac83;
  }
  List<String>::List((List<String> *)(closePipe + 1),a);
  do {
    closePipe[0] = pipe(&local_dc);
    bVar4 = false;
    if (closePipe[0] == -1) {
      piVar8 = __errno_location();
      bVar4 = *piVar8 == 4;
    }
  } while (bVar4);
  bVar4 = SocketClient::setFlags(local_d8,1,1,2,FlagAppend);
  if (bVar4) {
    do {
      closePipe[0] = pipe(this->mStdIn);
      bVar4 = false;
      if (closePipe[0] == -1) {
        piVar8 = __errno_location();
        bVar4 = *piVar8 == 4;
      }
    } while (bVar4);
    do {
      closePipe[0] = pipe(this->mStdOut);
      bVar4 = false;
      if (closePipe[0] == -1) {
        piVar8 = __errno_location();
        bVar4 = *piVar8 == 4;
      }
    } while (bVar4);
    do {
      closePipe[0] = pipe(this->mStdErr);
      bVar4 = false;
      if (closePipe[0] == -1) {
        piVar8 = __errno_location();
        bVar4 = *piVar8 == 4;
      }
    } while (bVar4);
    if (this->mMode == Sync) {
      do {
        closePipe[0] = pipe(this->mSync);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
    }
    sVar9 = List<String>::size((List<String> *)(closePipe + 1));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar9 + 2;
    uVar10 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    __argv = (char **)operator_new__(uVar10);
    sVar9 = List<String>::size((List<String> *)(closePipe + 1));
    __argv[sVar9 + 1] = (char *)0x0;
    pcVar11 = String::nullTerminated((String *)local_80);
    *__argv = pcVar11;
    it_1._M_current._4_4_ = 1;
    local_120._M_current =
         (String *)
         std::vector<String,_std::allocator<String>_>::begin
                   ((vector<String,_std::allocator<String>_> *)(closePipe + 1));
    __gnu_cxx::__normal_iterator<String_const*,std::vector<String,std::allocator<String>>>::
    __normal_iterator<String*>
              ((__normal_iterator<String_const*,std::vector<String,std::allocator<String>>> *)
               &local_118,&local_120);
    while( true ) {
      iStack_128 = std::vector<String,_std::allocator<String>_>::end
                             ((vector<String,_std::allocator<String>_> *)(closePipe + 1));
      bVar4 = __gnu_cxx::operator!=(&local_118,&stack0xfffffffffffffed8);
      if (!bVar4) break;
      pSVar13 = __gnu_cxx::
                __normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>::
                operator->(&local_118);
      pcVar11 = String::nullTerminated(pSVar13);
      __argv[it_1._M_current._4_4_] = pcVar11;
      it_1._M_current._4_4_ = it_1._M_current._4_4_ + 1;
      __gnu_cxx::__normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>::
      operator++(&local_118);
    }
    bVar4 = std::vector<String,_std::allocator<String>_>::empty
                      (&environment->super_vector<String,_std::allocator<String>_>);
    sVar9 = List<String>::size(environment);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar9 + 1;
    uVar10 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pSVar12 = (String *)operator_new__(uVar10);
    it_2._M_current = pSVar12;
    sVar9 = List<String>::size(environment);
    *(undefined8 *)(&(pSVar12->mString)._M_dataplus + sVar9 * 8) = 0;
    if (!bVar4) {
      it_1._M_current._4_4_ = 0;
      local_140._M_current =
           (String *)
           std::vector<String,_std::allocator<String>_>::begin
                     (&environment->super_vector<String,_std::allocator<String>_>);
      while( true ) {
        local_148._M_current =
             (String *)
             std::vector<String,_std::allocator<String>_>::end
                       (&environment->super_vector<String,_std::allocator<String>_>);
        bVar5 = __gnu_cxx::operator!=(&local_140,&local_148);
        if (!bVar5) break;
        pSVar13 = __gnu_cxx::
                  __normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>::
                  operator->(&local_140);
        pcVar11 = String::nullTerminated(pSVar13);
        *(char **)(&((it_2._M_current)->mString)._M_dataplus + (long)it_1._M_current._4_4_ * 8) =
             pcVar11;
        it_1._M_current._4_4_ = it_1._M_current._4_4_ + 1;
        __gnu_cxx::__normal_iterator<const_String_*,_std::vector<String,_std::allocator<String>_>_>
        ::operator++(&local_140);
      }
    }
    ProcessThread::setPending(1);
    _Var6 = fork();
    this->mPid = _Var6;
    if (this->mPid == -1) {
      ProcessThread::setPending(-1);
      do {
        closePipe[0] = close(this->mStdIn[1]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdIn[0]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdOut[1]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdOut[0]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdErr[1]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdErr[0]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(local_d8);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(local_dc);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      String::String((String *)local_168,"Fork failed",0xffffffffffffffff);
      String::operator=(&this->mErrorString,(String *)local_168);
      String::~String((String *)local_168);
      if (it_2._M_current != (String *)0x0) {
        operator_delete__(it_2._M_current);
      }
      if (__argv != (char **)0x0) {
        operator_delete__(__argv);
      }
      this_local._4_4_ = Error;
    }
    else {
      if (this->mPid == 0) {
        do {
          closePipe[0] = close(local_dc);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(this->mStdIn[1]);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(this->mStdOut[0]);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(this->mStdErr[0]);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(0);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(1);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(2);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = dup2(this->mStdIn[0],0);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(this->mStdIn[0]);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = dup2(this->mStdOut[1],1);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(this->mStdOut[1]);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = dup2(this->mStdErr[1],2);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        do {
          closePipe[0] = close(this->mStdErr[1]);
          bVar5 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar5 = *piVar8 == 4;
          }
        } while (bVar5);
        bVar5 = String::isEmpty(&(this->mChRoot).super_String);
        if (!bVar5) {
          pcVar11 = String::constData(&(this->mChRoot).super_String);
          iVar7 = chroot(pcVar11);
          if (iVar7 != 0) goto LAB_002a99d2;
        }
        bVar5 = String::isEmpty(&(this->mCwd).super_String);
        if (!bVar5) {
          pcVar11 = String::constData(&(this->mCwd).super_String);
          iVar7 = chdir(pcVar11);
          if (iVar7 != 0) goto LAB_002a99d2;
        }
        if (!bVar4) {
          pcVar11 = String::nullTerminated((String *)local_80);
          flags = execve(pcVar11,__argv,(char **)it_2._M_current);
        }
        else {
          pcVar11 = String::nullTerminated((String *)local_80);
          flags = execv(pcVar11,__argv);
        }
LAB_002a99d2:
        c_1 = 'c';
        do {
          sVar14 = ::write(local_d8,&c_1,1);
          closePipe[0] = (int)sVar14;
          bVar4 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar4 = *piVar8 == 4;
          }
        } while (bVar4);
        do {
          closePipe[0] = close(local_d8);
          bVar4 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar4 = *piVar8 == 4;
          }
        } while (bVar4);
        _exit(1);
      }
      if (it_2._M_current != (String *)0x0) {
        operator_delete__(it_2._M_current);
      }
      if (__argv != (char **)0x0) {
        operator_delete__(__argv);
      }
      do {
        closePipe[0] = close(local_d8);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdIn[0]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdOut[1]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        closePipe[0] = close(this->mStdErr[1]);
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        local_174 = fcntl(this->mStdIn[1],3,0);
        bVar4 = false;
        if (local_174 == 0xffffffff) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        local_174 = fcntl(this->mStdIn[1],4,(ulong)(local_174 | 0x800));
        bVar4 = false;
        if (local_174 == 0xffffffff) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        local_174 = fcntl(this->mStdOut[0],3,0);
        bVar4 = false;
        if (local_174 == 0xffffffff) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        local_174 = fcntl(this->mStdOut[0],4,(ulong)(local_174 | 0x800));
        bVar4 = false;
        if (local_174 == 0xffffffff) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        local_174 = fcntl(this->mStdErr[0],3,0);
        bVar4 = false;
        if (local_174 == 0xffffffff) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        local_174 = fcntl(this->mStdErr[0],4,(ulong)(local_174 | 0x800));
        bVar4 = false;
        if (local_174 == 0xffffffff) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      do {
        sVar14 = read(local_dc,&local_175,1);
        closePipe[0] = (int)sVar14;
        bVar4 = false;
        if (closePipe[0] == -1) {
          piVar8 = __errno_location();
          bVar4 = *piVar8 == 4;
        }
      } while (bVar4);
      if (closePipe[0] == -1) {
        do {
          closePipe[0] = close(local_dc);
          bVar4 = false;
          if (closePipe[0] == -1) {
            piVar8 = __errno_location();
            bVar4 = *piVar8 == 4;
          }
        } while (bVar4);
        String::String(&local_198,"Failed to read from closePipe during process start",
                       0xffffffffffffffff);
        String::operator=(&this->mErrorString,&local_198);
        String::~String(&local_198);
        this->mPid = -1;
        ProcessThread::setPending(-1);
        this->mReturn = -1;
        this_local._4_4_ = Error;
      }
      else {
        if (closePipe[0] == 0) {
          do {
            closePipe[0] = close(local_dc);
            bVar4 = false;
            if (closePipe[0] == -1) {
              piVar8 = __errno_location();
              bVar4 = *piVar8 == 4;
            }
          } while (bVar4);
        }
        else if (closePipe[0] == 1) {
          do {
            closePipe[0] = close(local_dc);
            bVar4 = false;
            if (closePipe[0] == -1) {
              piVar8 = __errno_location();
              bVar4 = *piVar8 == 4;
            }
          } while (bVar4);
          String::String((String *)
                         &loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ,"Process failed to start",0xffffffffffffffff);
          String::operator=(&this->mErrorString,
                            (String *)
                            &loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
          String::~String((String *)
                          &loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
          this->mReturn = -1;
          this->mPid = -1;
          ProcessThread::setPending(-1);
          this_local._4_4_ = Error;
          goto LAB_002aac67;
        }
        ProcessThread::addPid(this->mPid,this,this->mMode == Async);
        if (this->mMode == Async) {
          EventLoop::eventLoop();
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1c8);
          if (bVar4) {
            peVar15 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1c8);
            iVar7 = this->mStdOut[0];
            local_210 = processCallback;
            local_208 = 0;
            local_218 = this;
            std::
            bind<void(Process::*)(int,int),Process*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                      (&local_200,(offset_in_Process_to_subr *)&local_210,&local_218,
                       (_Placeholder<1> *)&std::placeholders::_1,
                       (_Placeholder<2> *)&std::placeholders::_2);
            std::function<void(int,unsigned_int)>::
            function<std::_Bind<void(Process::*(Process*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                      ((function<void(int,unsigned_int)> *)&local_1e8,&local_200);
            EventLoop::registerSocket(peVar15,iVar7,1,&local_1e8);
            std::function<void_(int,_unsigned_int)>::~function(&local_1e8);
            peVar15 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1c8);
            iVar7 = this->mStdErr[0];
            local_260 = processCallback;
            local_258 = 0;
            started.tv_usec = (__suseconds_t)this;
            std::
            bind<void(Process::*)(int,int),Process*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                      (&local_250,(offset_in_Process_to_subr *)&local_260,
                       (Process **)&started.tv_usec,(_Placeholder<1> *)&std::placeholders::_1,
                       (_Placeholder<2> *)&std::placeholders::_2);
            std::function<void(int,unsigned_int)>::
            function<std::_Bind<void(Process::*(Process*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                      ((function<void(int,unsigned_int)> *)&local_238,&local_250);
            EventLoop::registerSocket(peVar15,iVar7,1,&local_238);
            std::function<void_(int,_unsigned_int)>::~function(&local_238);
          }
          std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_1c8);
          this_local._4_4_ = Done;
        }
        else {
          if (0 < timeout) {
            Rct::gettime((timeval *)&now.tv_usec);
            rfds.fds_bits[0xf] = (long)(timeout / 1000);
            timeoutForSelect.tv_sec = (long)((timeout % 1000) * 1000);
          }
          if ((execFlags & 1) == 0) {
            closeStdIn(this,CloseForce);
            this->mWantStdInClosed = false;
          }
          while( true ) {
            p_Stack_3a8 = wfds.fds_bits + 0xf;
            for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
              p_Stack_3a8[__arr._4_4_] = 0;
            }
            _ret_1 = local_398;
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              *(undefined8 *)(_ret_1 + (ulong)__arr_1._4_4_ * 8) = 0;
            }
            local_3bc = 0;
            iVar7 = this->mStdOut[0];
            iVar3 = iVar7;
            if (iVar7 < 0) {
              iVar3 = iVar7 + 0x3f;
            }
            wfds.fds_bits[(long)(iVar3 >> 6) + 0xf] =
                 wfds.fds_bits[(long)(iVar3 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar7 & 0x3f);
            piVar8 = std::max<int>(&local_3bc,this->mStdOut);
            local_3bc = *piVar8;
            iVar7 = this->mStdErr[0];
            iVar3 = iVar7;
            if (iVar7 < 0) {
              iVar3 = iVar7 + 0x3f;
            }
            wfds.fds_bits[(long)(iVar3 >> 6) + 0xf] =
                 wfds.fds_bits[(long)(iVar3 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar7 & 0x3f);
            piVar8 = std::max<int>(&local_3bc,this->mStdErr);
            local_3bc = *piVar8;
            iVar7 = this->mSync[0];
            iVar3 = iVar7;
            if (iVar7 < 0) {
              iVar3 = iVar7 + 0x3f;
            }
            wfds.fds_bits[(long)(iVar3 >> 6) + 0xf] =
                 wfds.fds_bits[(long)(iVar3 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar7 & 0x3f);
            piVar8 = std::max<int>(&local_3bc,this->mSync);
            local_3bc = *piVar8;
            if (this->mStdIn[1] != -1) {
              iVar7 = this->mStdIn[1];
              iVar3 = iVar7;
              if (iVar7 < 0) {
                iVar3 = iVar7 + 0x3f;
              }
              wfds.fds_bits[(long)(iVar3 >> 6) + -1] =
                   wfds.fds_bits[(long)(iVar3 >> 6) + -1] | 1L << ((ulong)(byte)iVar7 & 0x3f);
              piVar8 = std::max<int>(&local_3bc,this->mStdIn + 1);
              local_3bc = *piVar8;
            }
            do {
              if (timeout < 1) {
                local_678 = (timeval *)0x0;
              }
              else {
                local_678 = (timeval *)(rfds.fds_bits + 0xf);
              }
              local_3c0 = select(local_3bc + 1,(fd_set *)(wfds.fds_bits + 0xf),(fd_set *)local_398,
                                 (fd_set *)0x0,local_678);
              bVar4 = false;
              if (local_3c0 == -1) {
                piVar8 = __errno_location();
                bVar4 = *piVar8 == 4;
              }
            } while (bVar4);
            if (local_3c0 == -1) {
              String::String(&local_3e0,"Sync select failed: ",0xffffffffffffffff);
              String::operator=(&this->mErrorString,&local_3e0);
              String::~String(&local_3e0);
              piVar8 = __errno_location();
              Rct::strerror((Rct *)&lock,*piVar8);
              String::operator+=(&this->mErrorString,(String *)&lock);
              String::~String((String *)&lock);
              this_local._4_4_ = Error;
              goto LAB_002aac67;
            }
            if ((wfds.fds_bits[(long)(this->mStdOut[0] / 0x40) + 0xf] &
                1L << ((byte)((long)this->mStdOut[0] % 0x40) & 0x3f)) != 0) {
              handleOutput(this,this->mStdOut[0],&this->mStdOutBuffer,&this->mStdOutIndex,
                           &this->mReadyReadStdOut);
            }
            if ((wfds.fds_bits[(long)(this->mStdErr[0] / 0x40) + 0xf] &
                1L << ((byte)((long)this->mStdErr[0] % 0x40) & 0x3f)) != 0) {
              handleOutput(this,this->mStdErr[0],&this->mStdErrBuffer,&this->mStdErrIndex,
                           &this->mReadyReadStdErr);
            }
            if ((this->mStdIn[1] != -1) &&
               ((wfds.fds_bits[(long)(this->mStdIn[1] / 0x40) + -1] &
                1L << ((byte)((long)this->mStdIn[1] % 0x40) & 0x3f)) != 0)) {
              handleInput(this,this->mStdIn[1]);
            }
            if ((wfds.fds_bits[(long)(this->mSync[0] / 0x40) + 0xf] &
                1L << ((byte)((long)this->mSync[0] % 0x40) & 0x3f)) != 0) break;
            if (timeout != 0) {
              Rct::gettime((timeval *)&timeoutForSelect.tv_usec);
              local_41c = Rct::timevalDiff((timeval *)&timeoutForSelect.tv_usec,
                                           (timeval *)&now.tv_usec);
              if (timeout <= local_41c) {
                kill(this,0xf,__sig);
                ProcessThread::removePid(this->mPid);
                String::String(&local_440,"Timed out",0xffffffffffffffff);
                String::operator=(&this->mErrorString,&local_440);
                String::~String(&local_440);
                this_local._4_4_ = TimedOut;
                goto LAB_002aac67;
              }
              rfds.fds_bits[0xf] = (long)((timeout - local_41c) / 1000);
              timeoutForSelect.tv_sec = (long)(((timeout - local_41c) % 1000) * 1000);
            }
          }
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)&stack0xfffffffffffffbf8,&this->mMutex);
          if (this->mSync[1] != -1) {
            __assert_fail("mSync[1] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                          ,0x239,
                          "Process::ExecState Process::startInternal(const Path &, const List<String> &, const List<String> &, int, unsigned int)"
                         );
          }
          handleOutput(this,this->mStdOut[0],&this->mStdOutBuffer,&this->mStdOutIndex,
                       &this->mReadyReadStdOut);
          handleOutput(this,this->mStdErr[0],&this->mStdErrBuffer,&this->mStdErrIndex,
                       &this->mReadyReadStdErr);
          closeStdOut(this);
          closeStdErr(this);
          do {
            local_40c = close(this->mSync[0]);
            bVar4 = false;
            if (local_40c == -1) {
              piVar8 = __errno_location();
              bVar4 = *piVar8 == 4;
            }
          } while (bVar4);
          this->mSync[0] = -1;
          std::lock_guard<std::mutex>::~lock_guard
                    ((lock_guard<std::mutex> *)&stack0xfffffffffffffbf8);
          pPStack_418 = this;
          Signal<std::function<void(Process*)>>::operator()
                    ((Signal<std::function<void(Process*)>> *)&this->mFinished,
                     &stack0xfffffffffffffbe8);
          this_local._4_4_ = Done;
        }
      }
    }
  }
  else {
    String::String((String *)&args,"Unable to set FD_CLOEXEC",0xffffffffffffffff);
    String::operator=(&this->mErrorString,(String *)&args);
    String::~String((String *)&args);
    do {
      closePipe[0] = close(local_dc);
      bVar4 = false;
      if (closePipe[0] == -1) {
        piVar8 = __errno_location();
        bVar4 = *piVar8 == 4;
      }
    } while (bVar4);
    do {
      closePipe[0] = close(local_d8);
      bVar4 = false;
      if (closePipe[0] == -1) {
        piVar8 = __errno_location();
        bVar4 = *piVar8 == 4;
      }
    } while (bVar4);
    this_local._4_4_ = Error;
  }
LAB_002aac67:
  List<String>::~List((List<String> *)(closePipe + 1));
LAB_002aac83:
  Path::~Path((Path *)local_80);
  return this_local._4_4_;
}

Assistant:

Process::ExecState Process::startInternal(const Path &command, const List<String> &a, const List<String> &environment,
                                          int timeout, unsigned int execFlags)
{
    mErrorString.clear();

    const char *path = 0;
    for (const auto &it : environment) {
        if (it.startsWith("PATH=")) {
            path = it.constData() + 5;
            break;
        }
    }
    Path cmd = findCommand(command, path);
    if (cmd.isEmpty()) {
        mErrorString = "Command not found";
        return Error;
    }
    List<String> arguments = a;
    int err;

    int closePipe[2];
    eintrwrap(err, ::pipe(closePipe));
#ifdef HAVE_CLOEXEC
    if (!SocketClient::setFlags(closePipe[1], FD_CLOEXEC, F_GETFD, F_SETFD)) {
        mErrorString = "Unable to set FD_CLOEXEC";
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(closePipe[1]));
        return Error;
    }
#else
#warning No CLOEXEC, Process might have problematic behavior
#endif

    eintrwrap(err, ::pipe(mStdIn));
    eintrwrap(err, ::pipe(mStdOut));
    eintrwrap(err, ::pipe(mStdErr));
    if (mMode == Sync)
        eintrwrap(err, ::pipe(mSync));

    const char **args = new const char*[arguments.size() + 2];
    // const char* args[arguments.size() + 2];
    args[arguments.size() + 1] = 0;
    args[0] = cmd.nullTerminated();
    int pos = 1;
    for (List<String>::const_iterator it = arguments.begin(); it != arguments.end(); ++it) {
        args[pos] = it->nullTerminated();
        // printf("arg: '%s'\n", args[pos]);
        ++pos;
    }

    const bool hasEnviron = !environment.empty();

    const char **env = new const char*[environment.size() + 1];
    env[environment.size()] = 0;

    if (hasEnviron) {
        pos = 0;
        //printf("fork, about to exec '%s'\n", cmd.nullTerminated());
        for (List<String>::const_iterator it = environment.begin(); it != environment.end(); ++it) {
            env[pos] = it->nullTerminated();
            //printf("env: '%s'\n", env[pos]);
            ++pos;
        }
    }

    ProcessThread::setPending(1);

    mPid = ::fork();
    if (mPid == -1) {
        //printf("fork, something horrible has happened %d\n", errno);
        // bail out

        ProcessThread::setPending(-1);

        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[1]));
        eintrwrap(err, ::close(mStdErr[0]));
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(closePipe[0]));
        mErrorString = "Fork failed";
        delete[] env;
        delete[] args;
        return Error;
    } else if (mPid == 0) {
        //printf("fork, in child\n");
        // child, should do some error checking here really
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[0]));

        eintrwrap(err, ::close(STDIN_FILENO));
        eintrwrap(err, ::close(STDOUT_FILENO));
        eintrwrap(err, ::close(STDERR_FILENO));

        eintrwrap(err, ::dup2(mStdIn[0], STDIN_FILENO));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::dup2(mStdOut[1], STDOUT_FILENO));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::dup2(mStdErr[1], STDERR_FILENO));
        eintrwrap(err, ::close(mStdErr[1]));

        int ret;
        if (!mChRoot.isEmpty() && ::chroot(mChRoot.constData())) {
            goto error;
        }
        if (!mCwd.isEmpty() && ::chdir(mCwd.constData())) {
            goto error;
        }
        if (hasEnviron) {
            ret = ::execve(cmd.nullTerminated(), const_cast<char* const*>(args), const_cast<char* const*>(env));
        } else {
            ret = ::execv(cmd.nullTerminated(), const_cast<char* const*>(args));
        }
        // notify the parent process
  error:
        const char c = 'c';
        eintrwrap(err, ::write(closePipe[1], &c, 1));
        eintrwrap(err, ::close(closePipe[1]));
        ::_exit(1);
        (void)ret;
        //printf("fork, exec seemingly failed %d, %d %s\n", ret, errno, Rct::strerror().constData());
    } else {
        delete[] env;
        delete[] args;

        // parent
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdErr[1]));

        //printf("fork, in parent\n");

        int flags;
        eintrwrap(flags, fcntl(mStdIn[1], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdIn[1], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdOut[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdOut[0], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdErr[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdErr[0], F_SETFL, flags | O_NONBLOCK));

        // block until exec is called in the child or until exec fails
        {
            char c;
            eintrwrap(err, ::read(closePipe[0], &c, 1));
            (void)c;

            if (err == -1) {
                // bad
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Failed to read from closePipe during process start";
                mPid = -1;
                ProcessThread::setPending(-1);
                mReturn = ReturnCrashed;
                return Error;
            } else if (err == 0) {
                // process has started successfully
                eintrwrap(err, ::close(closePipe[0]));
            } else if (err == 1) {
                // process start failed
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Process failed to start";
                mReturn = ReturnCrashed;
                mPid = -1;
                ProcessThread::setPending(-1);
                return Error;
            }
        }

        ProcessThread::addPid(mPid, this, (mMode == Async));

        //printf("fork, about to add fds: stdin=%d, stdout=%d, stderr=%d\n", mStdIn[1], mStdOut[0], mStdErr[0]);
        if (mMode == Async) {
            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                loop->registerSocket(mStdOut[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
                loop->registerSocket(mStdErr[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            }
        } else {
            // select and stuff
            timeval started, now, timeoutForSelect;
            if (timeout > 0) {
                Rct::gettime(&started);
                timeoutForSelect.tv_sec = timeout / 1000;
                timeoutForSelect.tv_usec = (timeout % 1000) * 1000;
            }
            if (!(execFlags & NoCloseStdIn)) {
                closeStdIn(CloseForce);
                mWantStdInClosed = false;
            }
            for (;;) {
                // set up all the select crap
                fd_set rfds, wfds;
                FD_ZERO(&rfds);
                FD_ZERO(&wfds);
                int max = 0;
                FD_SET(mStdOut[0], &rfds);
                max = std::max(max, mStdOut[0]);
                FD_SET(mStdErr[0], &rfds);
                max = std::max(max, mStdErr[0]);
                FD_SET(mSync[0], &rfds);
                max = std::max(max, mSync[0]);
                if (mStdIn[1] != -1) {
                    FD_SET(mStdIn[1], &wfds);
                    max = std::max(max, mStdIn[1]);
                }
                int ret;
                eintrwrap(ret, ::select(max + 1, &rfds, &wfds, 0, timeout > 0 ? &timeoutForSelect : 0));
                if (ret == -1) { // ow
                    mErrorString = "Sync select failed: ";
                    mErrorString += Rct::strerror();
                    return Error;
                }
                // check fds and stuff
                if (FD_ISSET(mStdOut[0], &rfds))
                    handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                if (FD_ISSET(mStdErr[0], &rfds))
                    handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);
                if (mStdIn[1] != -1 && FD_ISSET(mStdIn[1], &wfds))
                    handleInput(mStdIn[1]);
                if (FD_ISSET(mSync[0], &rfds)) {
                    // we're done
                    {
                        std::lock_guard<std::mutex> lock(mMutex);
                        assert(mSync[1] == -1);

                        // try to read all remaining data on stdout and stderr
                        handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                        handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);

                        closeStdOut();
                        closeStdErr();

                        int w;
                        eintrwrap(w, ::close(mSync[0]));
                        mSync[0] = -1;
                    }
                    mFinished(this);
                    return Done;
                }
                if (timeout) {
                    Rct::gettime(&now);

                    // lasted is the amount of time we spent until now in ms
                    const int lasted = Rct::timevalDiff(&now, &started);
                    if (lasted >= timeout) {
                        // timeout, we're done
                        kill(); // attempt to kill

                        // we need to remove this Process object from
                        // ProcessThread, because ProcessThread will try to
                        // finish() this object. However, this object may
                        // already have been deleted *before* ProcessThread
                        // runs, creating a segfault.
                        ProcessThread::removePid(mPid);

                        mErrorString = "Timed out";
                        return TimedOut;
                    }

                    // (timeout - lasted) is guaranteed to be > 0 because of
                    // the check above.
                    timeoutForSelect.tv_sec = (timeout - lasted) / 1000;
                    timeoutForSelect.tv_usec = ((timeout - lasted) % 1000) * 1000;
                }
            }
        }
    }
    return Done;
}